

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::DynArrayDeleteMethod::DynArrayDeleteMethod
          (DynArrayDeleteMethod *this,Builtins *builtins)

{
  _Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SimpleSystemSubroutine::SimpleSystemSubroutine
            (&this->super_SimpleSystemSubroutine,Delete,Function,0,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_28,&(builtins->voidType).super_Type,true,true);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_28);
  (this->super_SimpleSystemSubroutine).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SimpleSystemSubroutine_00b7be60;
  return;
}

Assistant:

explicit DynArrayDeleteMethod(const Builtins& builtins) :
        SimpleSystemSubroutine(KnownSystemName::Delete, SubroutineKind::Function, 0, {},
                               builtins.voidType, true,
                               /* isFirstArgLValue */ true) {}